

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

bool __thiscall OIDType::generateInternalData(OIDType *this)

{
  pointer *ppuVar1;
  pointer pcVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  char *__s;
  uchar *puVar10;
  iterator iVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t temp [10];
  long tempVal;
  uchar local_48 [16];
  long local_38;
  
  lVar6 = std::__cxx11::string::find((char *)&this->_value,0x1784a8,0);
  if (lVar6 == 0) {
    puVar10 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start;
    iVar11._M_current =
         (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar11._M_current != puVar10) {
      (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar10;
      iVar11._M_current = puVar10;
    }
    local_48[0] = 0x2b;
    if (iVar11._M_current ==
        (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (&this->data,iVar11,local_48);
    }
    else {
      *iVar11._M_current = '+';
      ppuVar1 = &(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    pcVar2 = (this->_value)._M_dataplus._M_p;
    if (pcVar2[5] != '\0') {
      __s = pcVar2 + 5;
      do {
        pcVar7 = strchr(__s,0x2e);
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[0] = '\0';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        iVar5 = __isoc99_sscanf(__s,"%ld.",&local_38);
        lVar6 = local_38;
        if (iVar5 == 0) goto LAB_001690e2;
        sVar8 = recurse_longform(local_38,local_48,10);
        bVar3 = (byte)lVar6;
        bVar9 = bVar3 + 0x7f;
        if (-1 < lVar6) {
          bVar9 = bVar3;
        }
        uVar12 = (sVar8 << 0x20) + 0x100000000;
        local_48[(int)sVar8] = bVar3 - (bVar9 & 0x80);
        uVar13 = uVar12 >> 0x20;
        puVar10 = local_48;
        if ((int)(uVar12 >> 0x20) != 0 && -1 < (long)uVar12) {
          do {
            iVar11._M_current =
                 (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->data,iVar11,
                         puVar10);
            }
            else {
              *iVar11._M_current = *puVar10;
              ppuVar1 = &(this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            uVar13 = uVar13 - 1;
            puVar10 = puVar10 + 1;
          } while (uVar13 != 0);
        }
      } while ((pcVar7 != (char *)0x0) && (__s = pcVar7 + 1, pcVar7[1] != '\0'));
    }
    (this->super_BER_CONTAINER)._length =
         *(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    bVar4 = true;
  }
  else {
    this->valid = false;
LAB_001690e2:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool OIDType::generateInternalData() {
    if(_value.find(".1.3.") != 0) { this->valid = false; return false; }; // Invalid OID

    this->data.clear();
    this->data.push_back(0x2b); // first byte

    char* valuePtr = &_value[5];

    while(*valuePtr != 0){
        bool toBreak = false;
        char* startNum = valuePtr;

        // Find the end of this item (next dot or end of string)
        char* endNum = strchr(startNum, '.');
        if(!endNum) {
            toBreak = true;
        }

        long tempVal;
        uint8_t temp[10] = {0};
        if(sscanf(startNum, "%ld.", &tempVal)){
            int encoded_length = encode_ber_longform_integer(temp, tempVal, 10);

            for(int i = 0; i < encoded_length; i++){
                this->data.push_back(temp[i]);
            }

            if(toBreak) break;
            valuePtr = endNum+1;
        } else {
            return false;
        }
    }

    this->_length = this->data.size();
    return true;
}